

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint32_t original;
  Iter *this_local;
  
  uVar2 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block.cc"
                  ,0x8f,"virtual void leveldb::Block::Iter::Prev()");
  }
  uVar2 = this->current_;
  while( true ) {
    uVar3 = GetRestartPoint(this,this->restart_index_);
    if (uVar3 < uVar2) {
      SeekToRestartPoint(this,this->restart_index_);
      do {
        bVar1 = ParseNextKey(this);
        bVar4 = false;
        if (bVar1) {
          uVar3 = NextEntryOffset(this);
          bVar4 = uVar3 < uVar2;
        }
      } while (bVar4);
      return;
    }
    if (this->restart_index_ == 0) break;
    this->restart_index_ = this->restart_index_ - 1;
  }
  this->current_ = this->restarts_;
  this->restart_index_ = this->num_restarts_;
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }